

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FSDist_COF::SampleState(FSDist_COF *this)

{
  int iVar1;
  ulong uVar2;
  const_reference pvVar3;
  const_reference this_00;
  const_reference pvVar4;
  reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index valI;
  double sum;
  double randNr;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *state;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  allocator_type *in_stack_ffffffffffffff90;
  uint local_3c;
  double local_38;
  uint local_28;
  
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xb085b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_RSI,(size_type)in_RDI,in_stack_ffffffffffffff90);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xb085d8);
  local_28 = 0;
  do {
    if ((in_RSI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish <= (pointer)(ulong)local_28) {
      return in_RDI;
    }
    iVar1 = rand();
    local_38 = 0.0;
    local_3c = 0;
    while( true ) {
      uVar2 = (ulong)local_3c;
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          &(in_RSI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_28);
      if (*pvVar3 <= uVar2) break;
      this_00 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)(in_RSI + 2),(ulong)local_28);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_3c);
      local_38 = *pvVar4 + local_38;
      if ((double)iVar1 / 2147483648.0 <= local_38) {
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(local_3c,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
        *pvVar5 = local_3c;
        break;
      }
      local_3c = local_3c + 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

vector<Index> FSDist_COF::SampleState() const
{
    vector<Index> state(_m_nrStateFactors);

    for(Index i=0; i < _m_nrStateFactors; i++)    
    {  
        double randNr=rand() / (RAND_MAX + 1.0);
        double sum=0;
        for(Index valI = 0; valI < _m_sfacDomainSizes[i]; valI++)
        {
            sum+=_m_probs[i][valI];
            if(randNr<=sum)
            {
                state.at(i)=valI;
                break;
            }
        }
    }
    return state;
}